

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

shared_ptr<chatra::Node> __thiscall
chatra::
extractStatementPiece<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
          (chatra *this,ParserContext *ct,
          __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
          *it,__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
              last,StatementPatternElement *e)

{
  Operator OVar1;
  StringId SVar2;
  Token **ppTVar3;
  pointer psVar4;
  char *pcVar5;
  element_type *peVar6;
  Token *pTVar7;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  long *plVar11;
  iterator iVar12;
  undefined7 extraout_var;
  shared_ptr<chatra::Node> *psVar13;
  undefined8 *puVar14;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  _Var15;
  uint *puVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  uint *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  shared_ptr<chatra::Node> *psVar17;
  Token *pTVar18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  Token **ppTVar19;
  shared_ptr<chatra::Node> *psVar20;
  bool bVar21;
  OperatorPattern *pattern;
  long lVar22;
  Token **ppTVar23;
  element_type *peVar24;
  shared_ptr<chatra::Node> sVar25;
  chatra local_1d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  __shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> local_1c8;
  chatra local_1b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b0;
  __shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> local_1a8;
  __shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> local_198;
  __shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> local_178;
  shared_ptr<chatra::Node> local_168;
  StatementPatternElement *local_158;
  ParserContext *local_150;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  local_148;
  shared_ptr<chatra::Node> *local_140;
  undefined1 local_138 [16];
  pointer local_128;
  string local_120;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  local_100;
  undefined1 auStack_f8 [8];
  shared_ptr<chatra::Node> n;
  __node_base_ptr ap_Stack_c8 [2];
  undefined1 auStack_b8 [8];
  vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
  stack;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  *local_70;
  undefined1 auStack_68 [8];
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> nodes;
  allocator local_39;
  ParserContext *local_38;
  ParserContext *ct_00;
  
  ppTVar3 = it->_M_current;
  puVar16 = (uint *)it;
  local_158 = e;
  local_70 = it;
  local_38 = ct;
  if (OperatorParameter < e->type) goto LAB_0017ddaf;
  uVar10 = (long)last._M_current - (long)ppTVar3 >> 3;
  puVar16 = &switchD_0017c79f::switchdataD_001b9e18;
  switch(e->type) {
  case Token:
    if ((*ppTVar3)->sid == e->token) {
LAB_0017ca66:
      it->_M_current = ppTVar3 + 1;
      sVar25 = createNameNode(this,*ppTVar3);
      puVar16 = (uint *)sVar25.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
      goto LAB_0017ddfd;
    }
    break;
  default:
    if ((*ppTVar3)->type == Name) goto LAB_0017ca66;
    break;
  case VariationName:
    if (((1 < uVar10) && ((*ppTVar3)->sid == OpElementSelection)) &&
       (pTVar18 = ppTVar3[1], pTVar18->type == Name)) {
LAB_0017caad:
      sVar25 = createNameNode(this,pTVar18);
      puVar16 = (uint *)sVar25.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
      local_70->_M_current = local_70->_M_current + 2;
      goto LAB_0017ddfd;
    }
    break;
  case LabelWithColon:
    if (((1 < uVar10) && (pTVar18 = *ppTVar3, pTVar18->type == Name)) && (ppTVar3[1]->sid == Colon))
    goto LAB_0017caad;
    break;
  case StorageClassSpecifier:
    if ((*ppTVar3)->sid == Static) {
      it->_M_current = ppTVar3 + 1;
      createNameNode(local_1d8,*ppTVar3);
      wrapByTuple(this,(shared_ptr<chatra::Node> *)local_1d8,(Token *)0x0);
      this_00 = &local_1d0;
LAB_0017d4a6:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
      puVar16 = (uint *)extraout_RDX_01;
      goto LAB_0017ddfd;
    }
    break;
  case Expression:
    if (ppTVar3 == last._M_current) goto LAB_0017dd9a;
    stack.
    super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_b8 = (undefined1  [8])0x0;
    stack.
    super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    for (ppTVar19 = ppTVar3; ppTVar19 != last._M_current; ppTVar19 = ppTVar19 + 1) {
      pTVar18 = *ppTVar19;
      if (pTVar18->type == CloseBracket) {
        SVar2 = pTVar18->sid;
        if (SVar2 == CloseBrace) {
          bVar8 = checkBracketPair(local_38,pTVar18,
                                   (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                    *)auStack_b8,OpenBrace);
        }
        else if (SVar2 == CloseBracket) {
          bVar8 = checkBracketPair(local_38,pTVar18,
                                   (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                    *)auStack_b8,OpenBracket);
        }
        else {
          if (SVar2 != CloseParenthesis) {
            std::__cxx11::string::string
                      ((string *)auStack_f8,"internal error",(allocator *)&local_98);
            auStack_68 = (undefined1  [8])0x0;
            nodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            nodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ParserContext::errorAtToken
                      (local_38,Error,pTVar18,(string *)auStack_f8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)auStack_68);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_68);
            std::__cxx11::string::~string((string *)auStack_f8);
            puVar14 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar14 = &PTR__exception_0023d4d0;
            __cxa_throw(puVar14,&AbortCompilingException::typeinfo,std::exception::~exception);
          }
          bVar8 = checkBracketPair(local_38,pTVar18,
                                   (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                    *)auStack_b8,OpenParenthesis);
        }
        _Var15._M_current = ppTVar3;
        if (bVar8 == false) goto LAB_0017d167;
      }
      else if (pTVar18->type == OpenBracket) {
        std::
        vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
        ::emplace_back<chatra::StringId_const&,chatra::Token_const*const&>
                  ((vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                    *)auStack_b8,&pTVar18->sid,ppTVar19);
      }
    }
    _Var15._M_current = ppTVar19;
    if (auStack_b8 !=
        (undefined1  [8])
        stack.
        super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pTVar18 = ppTVar19[-1];
      std::__cxx11::string::string((string *)&local_98,"unmatched \'",&local_39);
      StringTable::ref_abi_cxx11_
                (&local_120,
                 (local_38->sTable->
                 super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 stack.
                 super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].first);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_68
                     ,&local_98,&local_120);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_f8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      auStack_68,"\'");
      local_138._0_8_ = (pointer)0x0;
      local_138._8_8_ = (pointer)0x0;
      local_128 = (pointer)0x0;
      ParserContext::errorAtNextToken
                (local_38,Error,pTVar18,(string *)auStack_f8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_138);
      std::__cxx11::string::~string((string *)auStack_f8);
      std::__cxx11::string::~string((string *)auStack_68);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_98);
      _Var15._M_current = ppTVar3;
    }
LAB_0017d167:
    std::
    _Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
    ::~_Vector_base((_Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                     *)auStack_b8);
    if (_Var15._M_current == local_70->_M_current) goto LAB_0017dd9a;
    sVar25 = parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                       (this,local_38,
                        (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                         )local_70->_M_current,_Var15);
    puVar16 = (uint *)sVar25.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
    local_70->_M_current = _Var15._M_current;
    if (*(long *)this != 0) goto LAB_0017ddfd;
    goto LAB_0017dda6;
  case TupleExpression:
    if (ppTVar3 != last._M_current) {
      stack.
      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_b8 = (undefined1  [8])0x0;
      stack.
      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      for (ppTVar19 = ppTVar3; ppTVar19 != last._M_current; ppTVar19 = ppTVar19 + 1) {
        pTVar18 = *ppTVar19;
        if (pTVar18->type == CloseBracket) {
          SVar2 = pTVar18->sid;
          if (SVar2 == CloseBrace) {
            bVar8 = checkBracketPair(local_38,pTVar18,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)auStack_b8,OpenBrace);
          }
          else if (SVar2 == CloseBracket) {
            bVar8 = checkBracketPair(local_38,pTVar18,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)auStack_b8,OpenBracket);
          }
          else {
            if (SVar2 != CloseParenthesis) {
              std::__cxx11::string::string
                        ((string *)auStack_f8,"internal error",(allocator *)&local_98);
              auStack_68 = (undefined1  [8])0x0;
              nodes.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              nodes.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              ParserContext::errorAtToken
                        (local_38,Error,pTVar18,(string *)auStack_f8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_68);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_68);
              std::__cxx11::string::~string((string *)auStack_f8);
              puVar14 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar14 = &PTR__exception_0023d4d0;
              __cxa_throw(puVar14,&AbortCompilingException::typeinfo,std::exception::~exception);
            }
            bVar8 = checkBracketPair(local_38,pTVar18,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)auStack_b8,OpenParenthesis);
          }
          _Var15._M_current = ppTVar3;
          if (bVar8 == false) goto LAB_0017cfec;
        }
        else if (pTVar18->type == OpenBracket) {
          std::
          vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
          ::emplace_back<chatra::StringId_const&,chatra::Token_const*const&>
                    ((vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                      *)auStack_b8,&pTVar18->sid,ppTVar19);
        }
      }
      _Var15._M_current = ppTVar19;
      if (auStack_b8 !=
          (undefined1  [8])
          stack.
          super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pTVar18 = ppTVar19[-1];
        std::__cxx11::string::string((string *)&local_98,"unmatched \'",&local_39);
        StringTable::ref_abi_cxx11_
                  (&local_120,
                   (local_38->sTable->
                   super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                   stack.
                   super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[-1].first);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_68,&local_98,&local_120);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_68,"\'");
        local_138._0_8_ = (pointer)0x0;
        local_138._8_8_ = (pointer)0x0;
        local_128 = (pointer)0x0;
        ParserContext::errorAtNextToken
                  (local_38,Error,pTVar18,(string *)auStack_f8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_138);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_138);
        std::__cxx11::string::~string((string *)auStack_f8);
        std::__cxx11::string::~string((string *)auStack_68);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_98);
        _Var15._M_current = ppTVar3;
      }
LAB_0017cfec:
      std::
      _Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ::~_Vector_base((_Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                       *)auStack_b8);
      if (_Var15._M_current != local_70->_M_current) {
        sVar25 = parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                           (this,local_38,
                            (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                             )local_70->_M_current,_Var15);
        puVar16 = (uint *)sVar25.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
        local_70->_M_current = _Var15._M_current;
        if (*(long *)this == 0) goto LAB_0017dda6;
        if (*(char *)(*(long *)this + 0x40) != '/') goto LAB_0017ddfd;
        std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1c8,(__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)this);
        wrapByTuple((chatra *)auStack_f8,(shared_ptr<chatra::Node> *)&local_1c8,(Token *)0x0);
        std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_f8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&n);
        this_00 = &local_1c8._M_refcount;
        goto LAB_0017d4a6;
      }
    }
    goto LAB_0017dd9a;
  case ParameterList:
    if ((*ppTVar3)->sid == OpenParenthesis) {
      ppTVar19 = ppTVar3 + 1;
      local_100._M_current = ppTVar19;
      if (ppTVar19 != last._M_current) {
        stack.
        super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        auStack_b8 = (undefined1  [8])0x0;
        stack.
        super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        lVar22 = 0;
        for (; _Var15._M_current = ppTVar19, ppTVar19 != last._M_current; ppTVar19 = ppTVar19 + 1) {
          pTVar18 = *ppTVar19;
          if ((auStack_b8 ==
               (undefined1  [8])
               stack.
               super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start) && (pTVar18->sid == CloseParenthesis))
          goto LAB_0017daec;
          if (pTVar18->type == CloseBracket) {
            SVar2 = pTVar18->sid;
            if (SVar2 == CloseBrace) {
              bVar8 = checkBracketPair(local_38,pTVar18,
                                       (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                        *)auStack_b8,OpenBrace);
            }
            else if (SVar2 == CloseBracket) {
              bVar8 = checkBracketPair(local_38,pTVar18,
                                       (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                        *)auStack_b8,OpenBracket);
            }
            else {
              if (SVar2 != CloseParenthesis) {
                std::__cxx11::string::string
                          ((string *)auStack_f8,"internal error",(allocator *)&local_98);
                auStack_68 = (undefined1  [8])0x0;
                nodes.
                super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                nodes.
                super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                ParserContext::errorAtToken
                          (local_38,Error,pTVar18,(string *)auStack_f8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_68);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_68);
                std::__cxx11::string::~string((string *)auStack_f8);
                puVar14 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar14 = &PTR__exception_0023d4d0;
                __cxa_throw(puVar14,&AbortCompilingException::typeinfo,std::exception::~exception);
              }
              bVar8 = checkBracketPair(local_38,pTVar18,
                                       (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                        *)auStack_b8,OpenParenthesis);
            }
            _Var15._M_current = local_100._M_current;
            if (bVar8 == false) goto LAB_0017daec;
          }
          else if (pTVar18->type == OpenBracket) {
            std::
            vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
            ::emplace_back<chatra::StringId_const&,chatra::Token_const*const&>
                      ((vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                        *)auStack_b8,&pTVar18->sid,ppTVar19);
          }
          lVar22 = lVar22 + -8;
        }
        if (auStack_b8 !=
            (undefined1  [8])
            stack.
            super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          _Var15._M_current = ppTVar19 + -1;
          if (lVar22 == 0) {
            _Var15._M_current = local_100._M_current;
          }
          pTVar18 = *_Var15._M_current;
          std::__cxx11::string::string((string *)&local_98,"unmatched \'",&local_39);
          StringTable::ref_abi_cxx11_
                    (&local_120,
                     (local_38->sTable->
                     super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                     stack.
                     super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[-1].first);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_68,&local_98,&local_120);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_68,"\'");
          local_138._0_8_ = (pointer)0x0;
          local_138._8_8_ = (pointer)0x0;
          local_128 = (pointer)0x0;
          ParserContext::errorAtNextToken
                    (local_38,Error,pTVar18,(string *)auStack_f8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_138);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_138);
          std::__cxx11::string::~string((string *)auStack_f8);
          std::__cxx11::string::~string((string *)auStack_68);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_98);
          _Var15._M_current = local_100._M_current;
        }
LAB_0017daec:
        local_100._M_current = _Var15._M_current;
        std::
        _Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
        ::~_Vector_base((_Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                         *)auStack_b8);
        puVar16 = (uint *)extraout_RDX_04;
      }
      if ((local_100._M_current != last._M_current) &&
         ((*local_100._M_current)->sid == CloseParenthesis)) {
        ppTVar19 = local_70->_M_current;
        if (local_100._M_current != ppTVar19 + 1) {
          parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                    (local_1b8,local_38,
                     (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                      )(ppTVar19 + 1),local_100);
          wrapByTuple(this,(shared_ptr<chatra::Node> *)local_1b8,(Token *)0x0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0);
          auStack_f8 = (undefined1  [8])ap_Stack_c8;
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x1;
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ap_Stack_c8[0] = (__node_base_ptr)0x0;
          psVar13 = *(shared_ptr<chatra::Node> **)(*(long *)this + 0x60);
          psVar17 = *(shared_ptr<chatra::Node> **)(*(long *)this + 0x68);
          bVar8 = false;
          local_148._M_current = (Token **)((ulong)local_148._M_current._4_4_ << 0x20);
          bVar21 = false;
          local_140 = psVar17;
LAB_0017dba6:
          if (psVar13 == psVar17) goto LAB_0017dfa6;
          peVar24 = (psVar13->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          OVar1 = peVar24->op;
          if (OVar1 == TupleDelimiter) {
            if (bVar21) {
              pTVar18 = *(peVar24->tokens).
                         super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              std::__cxx11::string::string
                        ((string *)auStack_68,"duplicated \";\"",(allocator *)&local_120);
              local_98._M_dataplus._M_p = (pointer)0x0;
              local_98._M_string_length = 0;
              local_98.field_2._M_allocated_capacity = 0;
              ParserContext::errorAtToken
                        (local_38,Error,pTVar18,(string *)auStack_68,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_98);
              goto LAB_0017e3b1;
            }
            bVar21 = true;
LAB_0017dbc8:
            bVar8 = false;
LAB_0017dcc6:
            psVar13 = psVar13 + 1;
            goto LAB_0017dba6;
          }
          if (bVar8) {
            pTVar18 = *(peVar24->tokens).
                       super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            std::__cxx11::string::string
                      ((string *)auStack_68,"variadic arguments should be last of parameters",
                       (allocator *)&local_120);
            local_98._M_dataplus._M_p = (pointer)0x0;
            local_98._M_string_length = 0;
            local_98.field_2._M_allocated_capacity = 0;
            ParserContext::errorAtToken
                      (local_38,Error,pTVar18,(string *)auStack_68,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_98);
            goto LAB_0017e3b1;
          }
          if (OVar1 == VarArg) {
            psVar20 = (peVar24->subNodes).
                      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            peVar24 = (psVar20->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            ;
            if (peVar24->type != Name) {
              pTVar18 = *(peVar24->tokens).
                         super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              std::__cxx11::string::string
                        ((string *)auStack_68,"expected parameter name",(allocator *)&local_120);
              local_98._M_dataplus._M_p = (pointer)0x0;
              local_98._M_string_length = 0;
              local_98.field_2._M_allocated_capacity = 0;
              ParserContext::errorAtToken
                        (local_38,Error,pTVar18,(string *)auStack_68,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_98);
              goto LAB_0017e3b1;
            }
            bVar9 = checkParameterNameDuplicated
                              (local_38,(unordered_set<chatra::StringId,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<chatra::StringId>_>
                                         *)auStack_f8,psVar20);
            bVar8 = true;
            if (!bVar9) goto LAB_0017e3c6;
            goto LAB_0017dcc6;
          }
          if (peVar24->type == Name) {
            if ((~(byte)local_148._M_current & 1) != 0 || bVar21) {
              bVar8 = checkParameterNameDuplicated
                                (local_38,(unordered_set<chatra::StringId,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<chatra::StringId>_>
                                           *)auStack_f8,psVar13);
              if (bVar8) goto LAB_0017dbc8;
              goto LAB_0017e3c6;
            }
            pTVar18 = *(peVar24->tokens).
                       super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            std::__cxx11::string::string
                      ((string *)auStack_68,
                       "parameter without default parameter cannot be placed after the one with default parameter in array-style parameters"
                       ,(allocator *)&local_120);
            local_98._M_dataplus._M_p = (pointer)0x0;
            local_98._M_string_length = 0;
            local_98.field_2._M_allocated_capacity = 0;
            ParserContext::errorAtToken
                      (local_38,Error,pTVar18,(string *)auStack_68,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_98);
            goto LAB_0017e3b1;
          }
          if (OVar1 == Pair) {
            bVar8 = checkParameterNameDuplicated
                              (local_38,(unordered_set<chatra::StringId,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<chatra::StringId>_>
                                         *)auStack_f8,
                               (peVar24->subNodes).
                               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
            if (!bVar8) goto LAB_0017e3c6;
            peVar24 = (psVar13->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            ;
            psVar4 = (peVar24->subNodes).
                     super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar5 = *(char **)&psVar4[1].
                                super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
            if (pcVar5[0x40] == 2) {
              bVar8 = matchesAsNameChain(*(shared_ptr<chatra::Node> **)(pcVar5 + 0x60));
              if (!bVar8) {
                pTVar18 = (Token *)**(undefined8 **)(pcVar5 + 0x18);
                pTVar7 = (peVar24->tokens).
                         super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1];
                std::__cxx11::string::string
                          ((string *)auStack_68,"expected constructor call",(allocator *)&local_120)
                ;
                local_98._M_dataplus._M_p = (pointer)0x0;
                local_98._M_string_length = 0;
                local_98.field_2._M_allocated_capacity = 0;
                ParserContext::errorAtToken
                          (local_38,Error,pTVar18,pTVar7,(string *)auStack_68,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_98);
                goto LAB_0017e3b1;
              }
              local_148._M_current._0_4_ = (int)CONCAT71(extraout_var,1);
            }
            else if ((*pcVar5 != '\x1a') &&
                    ((((pcVar5[0x40] & 0xfeU) != 0xc ||
                      (*(char *)**(undefined8 **)(pcVar5 + 0x60) != '\x1a')) &&
                     (bVar8 = matchesAsNameChain(psVar4 + 1), !bVar8)))) {
              pTVar18 = (Token *)**(undefined8 **)(pcVar5 + 0x18);
              pTVar7 = *(Token **)(*(long *)(pcVar5 + 0x20) + -8);
              std::__cxx11::string::string
                        ((string *)auStack_68,"expected class name or default value",
                         (allocator *)&local_120);
              local_98._M_dataplus._M_p = (pointer)0x0;
              local_98._M_string_length = 0;
              local_98.field_2._M_allocated_capacity = 0;
              ParserContext::errorAtToken
                        (local_38,Error,pTVar18,pTVar7,(string *)auStack_68,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_98);
              goto LAB_0017e3b1;
            }
            bVar8 = false;
            psVar17 = local_140;
            goto LAB_0017dcc6;
          }
          pTVar18 = *(peVar24->tokens).
                     super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pTVar7 = (peVar24->tokens).
                   super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1];
          std::__cxx11::string::string
                    ((string *)auStack_68,"expected parameter name",(allocator *)&local_120);
          local_98._M_dataplus._M_p = (pointer)0x0;
          local_98._M_string_length = 0;
          local_98.field_2._M_allocated_capacity = 0;
          ParserContext::errorAtToken
                    (local_38,Error,pTVar18,pTVar7,(string *)auStack_68,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_98);
LAB_0017e3b1:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_98);
          std::__cxx11::string::~string((string *)auStack_68);
LAB_0017e3c6:
          std::
          _Hashtable<chatra::StringId,_chatra::StringId,_std::allocator<chatra::StringId>,_std::__detail::_Identity,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<chatra::StringId,_chatra::StringId,_std::allocator<chatra::StringId>,_std::__detail::_Identity,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)auStack_f8);
          goto LAB_0017dda6;
        }
        local_70->_M_current = ppTVar19 + 2;
        local_168.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_168.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        wrapByTuple(this,&local_168,*ppTVar19);
        this_00 = &local_168.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        goto LAB_0017d4a6;
      }
    }
    break;
  case Qualifiers:
    if ((1 < uVar10) && ((*ppTVar3)->sid == As)) {
      local_148._M_current = ppTVar3 + 1;
      if (local_148._M_current != last._M_current) {
        stack.
        super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        auStack_b8 = (undefined1  [8])0x0;
        stack.
        super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_100._M_current = (Token **)0x8;
        for (ppTVar19 = (Token **)0x8; ppTVar23 = (Token **)((long)ppTVar3 + (long)ppTVar19),
            ppTVar23 != last._M_current; ppTVar19 = ppTVar19 + 1) {
          pTVar18 = *ppTVar23;
          if (pTVar18->type == CloseBracket) {
            SVar2 = pTVar18->sid;
            if (SVar2 == CloseBrace) {
              bVar8 = checkBracketPair(local_38,pTVar18,
                                       (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                        *)auStack_b8,OpenBrace);
            }
            else if (SVar2 == CloseBracket) {
              bVar8 = checkBracketPair(local_38,pTVar18,
                                       (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                        *)auStack_b8,OpenBracket);
            }
            else {
              if (SVar2 != CloseParenthesis) {
                std::__cxx11::string::string
                          ((string *)auStack_f8,"internal error",(allocator *)&local_98);
                auStack_68 = (undefined1  [8])0x0;
                nodes.
                super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                nodes.
                super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                ParserContext::errorAtToken
                          (local_38,Error,pTVar18,(string *)auStack_f8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_68);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_68);
                std::__cxx11::string::~string((string *)auStack_f8);
                puVar14 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar14 = &PTR__exception_0023d4d0;
                __cxa_throw(puVar14,&AbortCompilingException::typeinfo,std::exception::~exception);
              }
              bVar8 = checkBracketPair(local_38,pTVar18,
                                       (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                        *)auStack_b8,OpenParenthesis);
            }
            _Var15._M_current = local_100._M_current;
            if (bVar8 == false) goto LAB_0017dd81;
          }
          else if (pTVar18->type == OpenBracket) {
            std::
            vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
            ::emplace_back<chatra::StringId_const&,chatra::Token_const*const&>
                      ((vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                        *)auStack_b8,&pTVar18->sid,ppTVar23);
          }
        }
        _Var15._M_current = ppTVar19;
        if (auStack_b8 !=
            (undefined1  [8])
            stack.
            super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pTVar18 = *(Token **)((long)(ppTVar3 + -1) + (long)ppTVar19);
          std::__cxx11::string::string((string *)&local_98,"unmatched \'",&local_39);
          StringTable::ref_abi_cxx11_
                    (&local_120,
                     (local_38->sTable->
                     super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                     stack.
                     super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[-1].first);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_68,&local_98,&local_120);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_68,"\'");
          local_138._0_8_ = (pointer)0x0;
          local_138._8_8_ = (pointer)0x0;
          local_128 = (pointer)0x0;
          ParserContext::errorAtNextToken
                    (local_38,Error,pTVar18,(string *)auStack_f8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_138);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_138);
          std::__cxx11::string::~string((string *)auStack_f8);
          std::__cxx11::string::~string((string *)auStack_68);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_98);
          _Var15._M_current = local_100._M_current;
        }
LAB_0017dd81:
        local_100._M_current = _Var15._M_current;
        std::
        _Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
        ::~_Vector_base((_Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                         *)auStack_b8);
        if (local_100._M_current != (Token **)0x8) {
          _Var15._M_current = local_100._M_current + ppTVar3;
          parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                    (this,local_38,local_148,_Var15);
          if (*(long *)this != 0) {
            std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_1a8,(__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)this);
            wrapByTuple((chatra *)auStack_f8,(shared_ptr<chatra::Node> *)&local_1a8,(Token *)0x0);
            std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)this,
                       (__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_f8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&n);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8._M_refcount)
            ;
            psVar13 = *(shared_ptr<chatra::Node> **)(*(long *)this + 0x60);
            psVar17 = *(shared_ptr<chatra::Node> **)(*(long *)this + 0x68);
            puVar16 = (uint *)extraout_RDX_07;
LAB_0017de8d:
            if (psVar13 != psVar17) {
              bVar8 = matchesAsNameChain(psVar13);
              if ((bVar8) ||
                 (peVar24 = (psVar13->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr, peVar24->op == Call)) goto LAB_0017deaf;
              pTVar18 = *(peVar24->tokens).
                         super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pTVar7 = (peVar24->tokens).
                       super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1];
              std::__cxx11::string::string
                        ((string *)auStack_f8,"expected qualifiers",(allocator *)&local_98);
              auStack_68 = (undefined1  [8])0x0;
              nodes.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              nodes.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              ParserContext::errorAtToken
                        (local_38,Error,pTVar18,pTVar7,(string *)auStack_f8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_68);
LAB_0017d8d4:
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_68);
              std::__cxx11::string::~string((string *)auStack_f8);
              goto LAB_0017dda6;
            }
            local_70->_M_current = _Var15._M_current;
            goto LAB_0017ddfd;
          }
          goto LAB_0017dda6;
        }
      }
      goto LAB_0017dd9a;
    }
    break;
  case ClassList:
    if (ppTVar3 != last._M_current) {
      stack.
      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_b8 = (undefined1  [8])0x0;
      stack.
      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      for (ppTVar19 = ppTVar3; ppTVar19 != last._M_current; ppTVar19 = ppTVar19 + 1) {
        pTVar18 = *ppTVar19;
        if (pTVar18->type == CloseBracket) {
          SVar2 = pTVar18->sid;
          if (SVar2 == CloseBrace) {
            bVar8 = checkBracketPair(local_38,pTVar18,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)auStack_b8,OpenBrace);
          }
          else if (SVar2 == CloseBracket) {
            bVar8 = checkBracketPair(local_38,pTVar18,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)auStack_b8,OpenBracket);
          }
          else {
            if (SVar2 != CloseParenthesis) {
              std::__cxx11::string::string
                        ((string *)auStack_f8,"internal error",(allocator *)&local_98);
              auStack_68 = (undefined1  [8])0x0;
              nodes.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              nodes.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              ParserContext::errorAtToken
                        (local_38,Error,pTVar18,(string *)auStack_f8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_68);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_68);
              std::__cxx11::string::~string((string *)auStack_f8);
              puVar14 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar14 = &PTR__exception_0023d4d0;
              __cxa_throw(puVar14,&AbortCompilingException::typeinfo,std::exception::~exception);
            }
            bVar8 = checkBracketPair(local_38,pTVar18,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)auStack_b8,OpenParenthesis);
          }
          _Var15._M_current = ppTVar3;
          if (bVar8 == false) goto LAB_0017d291;
        }
        else if (pTVar18->type == OpenBracket) {
          std::
          vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
          ::emplace_back<chatra::StringId_const&,chatra::Token_const*const&>
                    ((vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                      *)auStack_b8,&pTVar18->sid,ppTVar19);
        }
      }
      _Var15._M_current = ppTVar19;
      if (auStack_b8 !=
          (undefined1  [8])
          stack.
          super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pTVar18 = ppTVar19[-1];
        std::__cxx11::string::string((string *)&local_98,"unmatched \'",&local_39);
        StringTable::ref_abi_cxx11_
                  (&local_120,
                   (local_38->sTable->
                   super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                   stack.
                   super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[-1].first);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_68,&local_98,&local_120);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_68,"\'");
        local_138._0_8_ = (pointer)0x0;
        local_138._8_8_ = (pointer)0x0;
        local_128 = (pointer)0x0;
        ParserContext::errorAtNextToken
                  (local_38,Error,pTVar18,(string *)auStack_f8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_138);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_138);
        std::__cxx11::string::~string((string *)auStack_f8);
        std::__cxx11::string::~string((string *)auStack_68);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_98);
        _Var15._M_current = ppTVar3;
      }
LAB_0017d291:
      std::
      _Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ::~_Vector_base((_Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                       *)auStack_b8);
      if (_Var15._M_current != local_70->_M_current) {
        parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                  (this,local_38,
                   (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                    )local_70->_M_current,_Var15);
        local_70->_M_current = _Var15._M_current;
        if (*(long *)this != 0) {
          std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_198,(__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)this);
          wrapByTuple((chatra *)auStack_f8,(shared_ptr<chatra::Node> *)&local_198,(Token *)0x0);
          std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)this,
                     (__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_f8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&n);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_198._M_refcount);
          psVar17 = *(shared_ptr<chatra::Node> **)(*(long *)this + 0x68);
          puVar16 = (uint *)extraout_RDX;
          for (psVar13 = *(shared_ptr<chatra::Node> **)(*(long *)this + 0x60); psVar13 != psVar17;
              psVar13 = psVar13 + 1) {
            bVar8 = matchesAsNameChain(psVar13);
            if (!bVar8) {
              peVar24 = (psVar13->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr;
              pTVar18 = *(peVar24->tokens).
                         super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pTVar7 = (peVar24->tokens).
                       super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1];
              std::__cxx11::string::string
                        ((string *)auStack_f8,"expected class names",(allocator *)&local_98);
              auStack_68 = (undefined1  [8])0x0;
              nodes.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              nodes.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              ParserContext::errorAtToken
                        (local_38,Error,pTVar18,pTVar7,(string *)auStack_f8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_68);
              goto LAB_0017d8d4;
            }
            puVar16 = (uint *)extraout_RDX_00;
          }
          goto LAB_0017ddfd;
        }
        goto LAB_0017dda6;
      }
    }
    goto LAB_0017dd9a;
  case VarDefinitions:
    if (ppTVar3 != last._M_current) {
      auStack_b8 = (undefined1  [8])0x0;
      stack.
      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      stack.
      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      for (ppTVar19 = ppTVar3; _Var15._M_current = ppTVar19, ppTVar19 != last._M_current;
          ppTVar19 = ppTVar19 + 1) {
        pTVar18 = *ppTVar19;
        if ((auStack_b8 ==
             (undefined1  [8])
             stack.
             super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start) && (pTVar18->sid == As)) goto LAB_0017d589;
        if (pTVar18->type == CloseBracket) {
          SVar2 = pTVar18->sid;
          if (SVar2 == CloseBrace) {
            bVar8 = checkBracketPair(local_38,pTVar18,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)auStack_b8,OpenBrace);
          }
          else if (SVar2 == CloseBracket) {
            bVar8 = checkBracketPair(local_38,pTVar18,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)auStack_b8,OpenBracket);
          }
          else {
            if (SVar2 != CloseParenthesis) {
              std::__cxx11::string::string
                        ((string *)auStack_f8,"internal error",(allocator *)&local_98);
              auStack_68 = (undefined1  [8])0x0;
              nodes.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              nodes.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              ParserContext::errorAtToken
                        (local_38,Error,pTVar18,(string *)auStack_f8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_68);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_68);
              std::__cxx11::string::~string((string *)auStack_f8);
              puVar14 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar14 = &PTR__exception_0023d4d0;
              __cxa_throw(puVar14,&AbortCompilingException::typeinfo,std::exception::~exception);
            }
            bVar8 = checkBracketPair(local_38,pTVar18,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)auStack_b8,OpenParenthesis);
          }
          _Var15._M_current = ppTVar3;
          if (bVar8 == false) goto LAB_0017d589;
        }
        else if (pTVar18->type == OpenBracket) {
          std::
          vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
          ::emplace_back<chatra::StringId_const&,chatra::Token_const*const&>
                    ((vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                      *)auStack_b8,&pTVar18->sid,ppTVar19);
        }
      }
      if (auStack_b8 !=
          (undefined1  [8])
          stack.
          super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pTVar18 = ppTVar19[-1];
        std::__cxx11::string::string((string *)&local_98,"unmatched \'",&local_39);
        StringTable::ref_abi_cxx11_
                  (&local_120,
                   (local_38->sTable->
                   super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                   stack.
                   super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[-1].first);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_68,&local_98,&local_120);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_68,"\'");
        local_138._0_8_ = (pointer)0x0;
        local_138._8_8_ = (pointer)0x0;
        local_128 = (pointer)0x0;
        ParserContext::errorAtNextToken
                  (local_38,Error,pTVar18,(string *)auStack_f8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_138);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_138);
        std::__cxx11::string::~string((string *)auStack_f8);
        std::__cxx11::string::~string((string *)auStack_68);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_98);
        _Var15._M_current = ppTVar3;
      }
LAB_0017d589:
      std::
      _Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ::~_Vector_base((_Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                       *)auStack_b8);
      if (_Var15._M_current != local_70->_M_current) {
        parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                  (this,local_38,
                   (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                    )local_70->_M_current,_Var15);
        local_70->_M_current = _Var15._M_current;
        if (*(long *)this != 0) {
          std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_188,(__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)this);
          wrapByTuple((chatra *)auStack_f8,(shared_ptr<chatra::Node> *)&local_188,(Token *)0x0);
          std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)this,
                     (__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_f8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&n);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_188._M_refcount);
          puVar16 = (uint *)extraout_RDX_02;
          for (plVar11 = *(long **)(*(long *)this + 0x60);
              plVar11 != *(long **)(*(long *)this + 0x68); plVar11 = plVar11 + 2) {
            puVar16 = (uint *)*plVar11;
            if ((*(char *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar16)->
                           _vptr__Sp_counted_base != '\x1b') &&
               ((*(char *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)puVar16 + 0x40))
                           ->_vptr__Sp_counted_base != '/' ||
                (*(char *)&(((Token *)
                            *((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)puVar16 + 0x60)
                             )->_vptr__Sp_counted_base)->line).
                           super___weak_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                 '\x1b')))) {
              pTVar18 = (Token *)**(undefined8 **)
                                   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    ((long)puVar16 + 0x10))->_M_use_count;
              pTVar7 = (Token *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                ((long)puVar16 + 0x20))->_vptr__Sp_counted_base[-1];
              std::__cxx11::string::string
                        ((string *)auStack_f8,"expected name [: value]",(allocator *)&local_98);
              auStack_68 = (undefined1  [8])0x0;
              nodes.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              nodes.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              ParserContext::errorAtToken
                        (local_38,Error,pTVar18,pTVar7,(string *)auStack_f8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_68);
              goto LAB_0017d8d4;
            }
          }
          goto LAB_0017ddfd;
        }
        goto LAB_0017dda6;
      }
    }
    goto LAB_0017dd9a;
  case ForLoopVariables:
    if (ppTVar3 != last._M_current) {
      auStack_b8 = (undefined1  [8])0x0;
      stack.
      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      stack.
      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      for (ppTVar19 = ppTVar3; _Var15._M_current = ppTVar19, ppTVar19 != last._M_current;
          ppTVar19 = ppTVar19 + 1) {
        pTVar18 = *ppTVar19;
        if ((auStack_b8 ==
             (undefined1  [8])
             stack.
             super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start) && (pTVar18->sid == In)) goto LAB_0017d420;
        if (pTVar18->type == CloseBracket) {
          SVar2 = pTVar18->sid;
          if (SVar2 == CloseBrace) {
            bVar8 = checkBracketPair(local_38,pTVar18,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)auStack_b8,OpenBrace);
          }
          else if (SVar2 == CloseBracket) {
            bVar8 = checkBracketPair(local_38,pTVar18,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)auStack_b8,OpenBracket);
          }
          else {
            if (SVar2 != CloseParenthesis) {
              std::__cxx11::string::string
                        ((string *)auStack_f8,"internal error",(allocator *)&local_98);
              auStack_68 = (undefined1  [8])0x0;
              nodes.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              nodes.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              ParserContext::errorAtToken
                        (local_38,Error,pTVar18,(string *)auStack_f8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_68);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_68);
              std::__cxx11::string::~string((string *)auStack_f8);
              puVar14 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar14 = &PTR__exception_0023d4d0;
              __cxa_throw(puVar14,&AbortCompilingException::typeinfo,std::exception::~exception);
            }
            bVar8 = checkBracketPair(local_38,pTVar18,
                                     (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                      *)auStack_b8,OpenParenthesis);
          }
          _Var15._M_current = ppTVar3;
          if (bVar8 == false) goto LAB_0017d420;
        }
        else if (pTVar18->type == OpenBracket) {
          std::
          vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
          ::emplace_back<chatra::StringId_const&,chatra::Token_const*const&>
                    ((vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                      *)auStack_b8,&pTVar18->sid,ppTVar19);
        }
      }
      if (auStack_b8 !=
          (undefined1  [8])
          stack.
          super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pTVar18 = ppTVar19[-1];
        std::__cxx11::string::string((string *)&local_98,"unmatched \'",&local_39);
        StringTable::ref_abi_cxx11_
                  (&local_120,
                   (local_38->sTable->
                   super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                   stack.
                   super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[-1].first);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_68,&local_98,&local_120);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_68,"\'");
        local_138._0_8_ = (pointer)0x0;
        local_138._8_8_ = (pointer)0x0;
        local_128 = (pointer)0x0;
        ParserContext::errorAtNextToken
                  (local_38,Error,pTVar18,(string *)auStack_f8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_138);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_138);
        std::__cxx11::string::~string((string *)auStack_f8);
        std::__cxx11::string::~string((string *)auStack_68);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_98);
        _Var15._M_current = ppTVar3;
      }
LAB_0017d420:
      std::
      _Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ::~_Vector_base((_Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                       *)auStack_b8);
      if (_Var15._M_current != local_70->_M_current) {
        parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                  (this,local_38,
                   (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                    )local_70->_M_current,_Var15);
        local_70->_M_current = _Var15._M_current;
        if (*(long *)this == 0) goto LAB_0017dda6;
        std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_178,(__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)this);
        wrapByTuple((chatra *)auStack_f8,(shared_ptr<chatra::Node> *)&local_178,(Token *)0x0);
        std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_f8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&n);
        this_00 = &local_178._M_refcount;
        goto LAB_0017d4a6;
      }
    }
LAB_0017dd9a:
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
LAB_0017dda6:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8));
    puVar16 = (uint *)extraout_RDX_05;
    break;
  case OperatorParameter:
    if ((*ppTVar3)->sid == OpenParenthesis) {
      ppTVar19 = ppTVar3 + 1;
      ppTVar23 = ppTVar3;
      local_100._M_current = ppTVar19;
      if (ppTVar19 != last._M_current) {
        stack.
        super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        auStack_b8 = (undefined1  [8])0x0;
        stack.
        super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        lVar22 = 0;
        for (; _Var15._M_current = ppTVar19, ppTVar19 != last._M_current; ppTVar19 = ppTVar19 + 1) {
          pTVar18 = *ppTVar19;
          if ((auStack_b8 ==
               (undefined1  [8])
               stack.
               super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start) && (pTVar18->sid == CloseParenthesis))
          goto LAB_0017d9db;
          if (pTVar18->type == CloseBracket) {
            SVar2 = pTVar18->sid;
            if (SVar2 == CloseBrace) {
              bVar8 = checkBracketPair(local_38,pTVar18,
                                       (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                        *)auStack_b8,OpenBrace);
            }
            else if (SVar2 == CloseBracket) {
              bVar8 = checkBracketPair(local_38,pTVar18,
                                       (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                        *)auStack_b8,OpenBracket);
            }
            else {
              if (SVar2 != CloseParenthesis) {
                std::__cxx11::string::string
                          ((string *)auStack_f8,"internal error",(allocator *)&local_98);
                auStack_68 = (undefined1  [8])0x0;
                nodes.
                super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                nodes.
                super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                ParserContext::errorAtToken
                          (local_38,Error,pTVar18,(string *)auStack_f8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_68);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_68);
                std::__cxx11::string::~string((string *)auStack_f8);
                puVar14 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar14 = &PTR__exception_0023d4d0;
                __cxa_throw(puVar14,&AbortCompilingException::typeinfo,std::exception::~exception);
              }
              bVar8 = checkBracketPair(local_38,pTVar18,
                                       (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                        *)auStack_b8,OpenParenthesis);
            }
            _Var15._M_current = local_100._M_current;
            if (bVar8 == false) goto LAB_0017d9db;
          }
          else if (pTVar18->type == OpenBracket) {
            std::
            vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
            ::emplace_back<chatra::StringId_const&,chatra::Token_const*const&>
                      ((vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                        *)auStack_b8,&pTVar18->sid,ppTVar19);
          }
          lVar22 = lVar22 + -8;
        }
        if (auStack_b8 !=
            (undefined1  [8])
            stack.
            super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          _Var15._M_current = ppTVar19 + -1;
          if (lVar22 == 0) {
            _Var15._M_current = local_100._M_current;
          }
          pTVar18 = *_Var15._M_current;
          std::__cxx11::string::string((string *)&local_98,"unmatched \'",&local_39);
          StringTable::ref_abi_cxx11_
                    (&local_120,
                     (local_38->sTable->
                     super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                     stack.
                     super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[-1].first);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_68,&local_98,&local_120);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_68,"\'");
          e = (StatementPatternElement *)local_138;
          local_138._0_8_ = (pointer)0x0;
          local_138._8_8_ = (pointer)0x0;
          local_128 = (pointer)0x0;
          ParserContext::errorAtNextToken
                    (local_38,Error,pTVar18,(string *)auStack_f8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)e);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_138);
          std::__cxx11::string::~string((string *)auStack_f8);
          std::__cxx11::string::~string((string *)auStack_68);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_98);
          _Var15._M_current = local_100._M_current;
        }
LAB_0017d9db:
        local_100._M_current = _Var15._M_current;
        std::
        _Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
        ::~_Vector_base((_Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                         *)auStack_b8);
        puVar16 = extraout_RDX_03;
        ppTVar23 = local_70->_M_current;
      }
      ct_00 = (ParserContext *)(ppTVar23 + 1);
      puVar16 = (uint *)CONCAT71((int7)((ulong)puVar16 >> 8),
                                 local_100._M_current == last._M_current ||
                                 (ParserContext *)local_100._M_current == ct_00);
      if ((local_100._M_current != last._M_current && (ParserContext *)local_100._M_current != ct_00
          ) && ((*local_100._M_current)->sid == CloseParenthesis)) {
        parseNodes<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                  ((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    *)auStack_68,(chatra *)local_38,ct_00,local_100,
                   (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                    )e);
        if (auStack_68 ==
            (undefined1  [8])
            nodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          *(undefined8 *)this = 0;
          *(undefined8 *)(this + 8) = 0;
        }
        else {
          local_150 = ct_00;
          for (iVar12._M_current = (shared_ptr<chatra::Node> *)auStack_68;
              (ulong)(opPairPattern._24_8_ - opPairPattern._16_8_) <=
              (ulong)((long)nodes.
                            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            ._M_impl.super__Vector_impl_data._M_start - (long)iVar12._M_current);
              iVar12._M_current = iVar12._M_current + 1) {
            extractOperator<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                      ((chatra *)auStack_f8,
                       (__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                        )auStack_68,
                       (__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                        )iVar12._M_current,(OperatorPattern *)opPairPattern);
            if (((auStack_f8 != (undefined1  [8])0x0) &&
                (*(char *)&(*(__node_base_ptr *)((long)auStack_f8 + 0x60))->_M_nxt->_M_nxt == '\x1b'
                )) && (*(char *)&((*(__node_base_ptr *)((long)auStack_f8 + 0x60))[2]._M_nxt)->_M_nxt
                       == '\x1b')) {
              iVar12 = std::
                       vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                       ::erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                *)auStack_68,(const_iterator)iVar12._M_current,
                               (shared_ptr<chatra::Node> *)
                               ((opPairPattern._24_8_ - opPairPattern._16_8_) +
                               (long)iVar12._M_current));
              iVar12 = std::
                       vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                       ::insert((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                 *)auStack_68,(const_iterator)iVar12._M_current,
                                (value_type *)auStack_f8);
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&n);
          }
          local_140 = DAT_0024f520;
          psVar13 = opPatterns;
          while (psVar13 != local_140) {
            peVar6 = psVar13[1].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_148._M_current = (Token **)psVar13;
            for (peVar24 = (element_type *)
                           (psVar13->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                           _M_refcount._M_pi; peVar24 != peVar6;
                peVar24 = (element_type *)
                          &(peVar24->tokens).
                           super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              if ((*(char *)(opAttrs + 4 +
                            (ulong)*(byte *)&(((weak_ptr<chatra::Line> *)&peVar24->type)->
                                             super___weak_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>
                                             )._M_ptr * 0x28) == '\x01') &&
                 ((ulong)((long)(peVar24->tokens).
                                super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                                ._M_impl.super__Vector_impl_data._M_start -
                         (long)(peVar24->line).
                               super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi) <=
                  (ulong)((long)nodes.
                                super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                ._M_impl.super__Vector_impl_data._M_start - (long)auStack_68))) {
                extractOperator<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                          (this,(__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                                 )auStack_68,
                           (__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                            )auStack_68,(OperatorPattern *)peVar24);
                if (*(long *)this != 0) goto LAB_0017deee;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8));
              }
            }
            psVar13 = (shared_ptr<chatra::Node> *)((long)local_148._M_current + 0x20);
          }
          pTVar18 = (Token *)local_150->ws;
          std::__cxx11::string::string
                    ((string *)auStack_f8,"expected operator parameter",(allocator *)&local_120);
          local_98._M_dataplus._M_p = (pointer)0x0;
          local_98._M_string_length = 0;
          local_98.field_2._M_allocated_capacity = 0;
          ParserContext::errorAtToken
                    (local_38,Error,pTVar18,(string *)auStack_f8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_98);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_98);
          std::__cxx11::string::~string((string *)auStack_f8);
          createNullNode(this,(Token *)local_150->ws);
        }
LAB_0017deee:
        std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ::~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   *)auStack_68);
        auStack_f8 = (undefined1  [8])ap_Stack_c8;
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x1;
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ap_Stack_c8[0] = (__node_base_ptr)0x0;
        psVar17 = *(shared_ptr<chatra::Node> **)(*(long *)this + 0x68);
        for (psVar13 = *(shared_ptr<chatra::Node> **)(*(long *)this + 0x60); psVar13 != psVar17;
            psVar13 = psVar13 + 1) {
          peVar24 = (psVar13->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if (peVar24->type == Name) {
            bVar8 = checkParameterNameDuplicated
                              (local_38,(unordered_set<chatra::StringId,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<chatra::StringId>_>
                                         *)auStack_f8,psVar13);
            if (!bVar8) goto LAB_0017e3c6;
          }
          else {
            if (peVar24->op != Pair) {
              pTVar18 = *(peVar24->tokens).
                         super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pTVar7 = (peVar24->tokens).
                       super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1];
              std::__cxx11::string::string
                        ((string *)auStack_68,"expected operator parameter",(allocator *)&local_120)
              ;
              local_98._M_dataplus._M_p = (pointer)0x0;
              local_98._M_string_length = 0;
              local_98.field_2._M_allocated_capacity = 0;
              ParserContext::errorAtToken
                        (local_38,Error,pTVar18,pTVar7,(string *)auStack_68,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_98);
              goto LAB_0017e3b1;
            }
            psVar20 = (peVar24->subNodes).
                      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            peVar24 = (psVar20->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            ;
            if (peVar24->type != Name) {
              pTVar18 = *(peVar24->tokens).
                         super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              std::__cxx11::string::string
                        ((string *)auStack_68,"expected parameter name",(allocator *)&local_120);
              local_98._M_dataplus._M_p = (pointer)0x0;
              local_98._M_string_length = 0;
              local_98.field_2._M_allocated_capacity = 0;
              ParserContext::errorAtToken
                        (local_38,Error,pTVar18,(string *)auStack_68,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_98);
              goto LAB_0017e3b1;
            }
            bVar8 = checkParameterNameDuplicated
                              (local_38,(unordered_set<chatra::StringId,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<chatra::StringId>_>
                                         *)auStack_f8,psVar20);
            if (!bVar8) goto LAB_0017e3c6;
            psVar20 = (((psVar13->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->subNodes).
                      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
            bVar8 = matchesAsNameChain(psVar20);
            if (!bVar8) {
              pTVar18 = *(((psVar20->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->tokens).
                         super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              std::__cxx11::string::string
                        ((string *)auStack_68,"expected class name",(allocator *)&local_120);
              local_98._M_dataplus._M_p = (pointer)0x0;
              local_98._M_string_length = 0;
              local_98.field_2._M_allocated_capacity = 0;
              ParserContext::errorAtToken
                        (local_38,Error,pTVar18,(string *)auStack_68,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_98);
              goto LAB_0017e3b1;
            }
          }
        }
LAB_0017dfa6:
        std::
        _Hashtable<chatra::StringId,_chatra::StringId,_std::allocator<chatra::StringId>,_std::__detail::_Identity,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<chatra::StringId,_chatra::StringId,_std::allocator<chatra::StringId>,_std::__detail::_Identity,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)auStack_f8);
        local_70->_M_current = local_100._M_current + 1;
        puVar16 = (uint *)extraout_RDX_09;
        goto LAB_0017ddfd;
      }
    }
  }
LAB_0017ddaf:
  if (local_158->required == true) {
    auStack_f8 = (undefined1  [8])0x0;
    n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ParserContext::errorAtToken
              (local_38,Error,*ppTVar3,&local_158->errorMessage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)auStack_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_f8);
    puVar16 = (uint *)extraout_RDX_06;
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
LAB_0017ddfd:
  sVar25.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar16;
  sVar25.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<chatra::Node>)
         sVar25.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
LAB_0017deaf:
  psVar13 = psVar13 + 1;
  puVar16 = (uint *)extraout_RDX_08;
  goto LAB_0017de8d;
}

Assistant:

static std::shared_ptr<Node> extractStatementPiece(ParserContext& ct, TokenPtrIterator& it, TokenPtrIterator last,
		const StatementPatternElement& e) {

	chatra_assert(it != last);
	auto it0 = it;
	auto leftTokens = static_cast<size_t>(std::distance(it, last));

	switch (e.type) {
	case StPt::Token:
		if (matches(**it, e.token))
			return createNameNode(**it++);
		break;

	case StPt::Name:
		if (matches(**it, TokenType::Name))
			return createNameNode(**it++);
		break;

	case StPt::VariationName:
		if (leftTokens >= 2 && matches(**it, StringId::OpElementSelection) && matches(**(it + 1), TokenType::Name)) {
			// Variation name is distinguishable from reserved words since it is always used with prefixed ".";
			// No checks performed.
			auto n = createNameNode(**(it + 1));
			it += 2;
			return n;
		}
		break;

	case StPt::Label:
		if (matches(**it, TokenType::Name))
			return createNameNode(**it++);
		break;

	case StPt::LabelWithColon:
		if (leftTokens >= 2 && matches(**it, TokenType::Name) && matches(**(it + 1), StringId::Colon)) {
			auto n = createNameNode(**it);
			it += 2;
			return n;
		}
		break;

	case StPt::StorageClassSpecifier:
		// Currently only supports "static"
		if (matches(**it, StringId::Static))
			return wrapByTuple(createNameNode(**it++));
		break;

	case StPt::Expression: {
		auto n = extractExpression(ct, it, last, [](const Token& token) { (void)token; return false; });
		if (!n)
			break;
		return n;
	}

	case StPt::TupleExpression: {
		auto n = extractExpression(ct, it, last, [](const Token& token) { (void)token; return false; });
		if (!n)
			break;
		if (isOperator(n, Operator::Pair))
			n = wrapByTuple(n);
		return n;
	}

	case StPt::ParameterList:
		if (matches(**it, StringId::OpenParenthesis)) {
			auto itBoundary = findExpressionBoundary(ct, it + 1, last, [](const Token& token) {
					return matches(token, StringId::CloseParenthesis); });
			// Empty parameter list means "void" function, so it should be accepted
			if (itBoundary == last || !matches(**itBoundary, StringId::CloseParenthesis))
				break;
			if (itBoundary == it + 1) {
				auto itHint = it;
				it += 2;
				return wrapByTuple(nullptr, *itHint);
			}

			auto n = wrapByTuple(parseExpression(ct, it + 1, itBoundary));
			if (!checkAsParameterList(ct, n))
				break;
			it = itBoundary + 1;
			return n;
		}
		break;

	case StPt::Qualifiers:
		if (leftTokens >= 2 && matches(**it, StringId::As)) {
			auto itExp = it + 1;
			auto n = extractExpression(ct, itExp, last, [](const Token& token) { (void)token; return false; });
			if (!n)
				break;
			n = wrapByTuple(n);
			if (!checkAsQualifiers(ct, n))
				break;
			it = itExp;
			return n;
		}
		break;

	case StPt::ClassList: {
		auto n = extractExpression(ct, it, last, [](const Token& token) { (void)token; return false; });
		if (!n)
			break;
		n = wrapByTuple(n);
		if (!checkAsClassList(ct, n))
			break;
		return n;
	}

	case StPt::VarDefinitions: {
		auto n = extractExpression(ct, it, last, [](const Token& token) { return matches(token, StringId::As); });
		if (!n)
			break;
		n = wrapByTuple(n);
		if (!checkAsVarDefinitions(ct, n))
			break;
		return n;
	}

	case StPt::ForLoopVariables: {
		auto n = extractExpression(ct, it, last, [](const Token& token) { return matches(token, StringId::In); });
		if (!n)
			break;
		n = wrapByTuple(n);
		// if (!checkAsForLoopVariables(ct, n))
		// 	break;
		return n;
	}

	case StPt::OperatorParameter:
		if (matches(**it, StringId::OpenParenthesis)) {
			auto itBoundary = findExpressionBoundary(ct, it + 1, last, [](const Token& token) {
				return matches(token, StringId::CloseParenthesis); });
			if (itBoundary == it + 1 || itBoundary == last || !matches(**itBoundary, StringId::CloseParenthesis))
				break;

			auto n = parseOperatorParameter(ct, it + 1, itBoundary);
			if (!checkAsOperatorParameter(ct, n))
				break;
			it = itBoundary + 1;
			return n;
		}
		break;
	}

	if (e.required) {
		chatra_assert(!e.errorMessage.empty());
		ct.errorAtToken(ErrorLevel::Error, **it0, e.errorMessage, {});
	}

	return nullptr;
}